

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O2

int __thiscall jrtplib::RTCPCompoundPacketBuilder::SDES::AddSSRC(SDES *this,uint32_t ssrc)

{
  SDESSource *s;
  
  s = (SDESSource *)operator_new(0x38,(this->super_RTPMemoryObject).mgr,0x1f);
  (s->super_RTPMemoryObject).mgr = (this->super_RTPMemoryObject).mgr;
  (s->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__SDESSource_0014dda8;
  s->ssrc = ssrc;
  (s->items).
  super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&s->items;
  (s->items).
  super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&s->items;
  (s->items).
  super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ._M_impl._M_node._M_size = 0;
  s->totalitemsize = 0;
  std::__cxx11::
  list<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
  ::push_back(&this->sdessources,&s);
  (this->sdesit)._M_node =
       (this->sdessources).
       super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
       ._M_impl._M_node.super__List_node_base._M_prev;
  return 0;
}

Assistant:

int AddSSRC(uint32_t ssrc)
		{
			SDESSource *s = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_SDESSOURCE) SDESSource(ssrc,GetMemoryManager());
			if (s == 0)
				return ERR_RTP_OUTOFMEM;
			sdessources.push_back(s);
			sdesit = sdessources.end();
			sdesit--;
			return 0;
		}